

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.h
# Opt level: O3

void __thiscall
fmt::v11::
print<unsigned_short&,unsigned_short&,unsigned_short&,unsigned_short&,unsigned_short&,unsigned_short&>
          (v11 *this,
          format_string<unsigned_short_&,_unsigned_short_&,_unsigned_short_&,_unsigned_short_&,_unsigned_short_&,_unsigned_short_&>
          fmt,unsigned_short *args,unsigned_short *args_1,unsigned_short *args_2,
          unsigned_short *args_3,unsigned_short *args_4,unsigned_short *args_5)

{
  string_view fmt_00;
  format_args args_00;
  ulong local_68 [2];
  ulong local_58;
  ulong local_48;
  ulong local_38;
  ulong local_28;
  ulong local_18;
  
  fmt_00.size_ = fmt.str_.data_;
  local_68[0] = (ulong)*(ushort *)fmt.str_.size_;
  local_58 = (ulong)*args;
  local_48 = (ulong)*args_1;
  local_38 = (ulong)*args_2;
  local_28 = (ulong)*args_3;
  local_18 = (ulong)*args_4;
  fmt_00.data_ = (char *)this;
  args_00.field_1.values_ = (value<fmt::v11::context> *)local_68;
  args_00.desc_ = 0x222222;
  vprint(fmt_00,args_00);
  return;
}

Assistant:

FMT_INLINE void print(format_string<T...> fmt, T&&... args) {
  const auto& vargs = fmt::make_format_args(args...);
  if (!detail::use_utf8()) return detail::vprint_mojibake(stdout, fmt, vargs);
  return detail::is_locking<T...>() ? vprint_buffered(stdout, fmt, vargs)
                                    : vprint(fmt, vargs);
}